

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O2

void __thiscall
JsUtil::
SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
::Initialize(SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
             *this,int capacity)

{
  code *pcVar1;
  bool bVar2;
  uint bucketCount;
  undefined4 *puVar3;
  uint size;
  int *local_50;
  int *newBuckets;
  EntryType *newEntries;
  WeakType *newWeakRefs;
  int modIndex;
  
  size = 4;
  if (4 < capacity) {
    size = capacity;
  }
  newWeakRefs._4_4_ = 0x4b;
  bucketCount = DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>::GetBucketSize
                          (size,(int *)((long)&newWeakRefs + 4));
  if (bucketCount == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                       ,0x1b3,"(initBucketCount > 0)",
                       "Size returned by policy should be greater than 0");
    if (!bVar2) goto LAB_00b82ab7;
    *puVar3 = 0;
  }
  local_50 = (int *)0x0;
  newBuckets = (int *)0x0;
  newEntries = (EntryType *)0x0;
  Allocate(this,&local_50,(EntryType **)&newBuckets,(WeakType **)&newEntries,bucketCount,size);
  Memory::WriteBarrierPtr<int>::WriteBarrierSet(&this->buckets,local_50);
  Memory::
  WriteBarrierPtr<JsUtil::(anonymous_namespace)::ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_>_>
  ::operator=(&this->entries,
              (ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_> *)newBuckets);
  Memory::WriteBarrierPtr<Memory::RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*>_>::
  WriteBarrierSet(&this->weakRefs,
                  (RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*> *)newEntries);
  this->bucketCount = bucketCount;
  this->size = size;
  this->modFunctionIndex = newWeakRefs._4_4_;
  if (this->freeCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                       ,0x1c1,"(this->freeCount == 0)","this->freeCount == 0");
    if (!bVar2) {
LAB_00b82ab7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void Initialize(int capacity)
        {
            // minimum capacity is 4
            int initSize = max(capacity, 4);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint initBucketCount = SizePolicy::GetBucketSize(initSize, &modIndex);
            AssertMsg(initBucketCount > 0, "Size returned by policy should be greater than 0");

            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            WeakType* newWeakRefs = nullptr;
            Allocate(&newBuckets, &newEntries, &newWeakRefs, initBucketCount, initSize);

            // Allocation can throw - assign only after allocation has succeeded.
            this->buckets = newBuckets;
            this->entries = newEntries;
            this->weakRefs = newWeakRefs;
            this->bucketCount = initBucketCount;
            this->size = initSize;
            this->modFunctionIndex = modIndex;
            Assert(this->freeCount == 0);
        }